

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

AnonymousProgramSyntax * __thiscall
slang::parsing::Parser::parseAnonymousProgram(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token semi_00;
  Token keyword_00;
  Token endkeyword_00;
  Preprocessor *this_00;
  AnonymousProgramSyntax *pAVar1;
  ParserBase *in_RDI;
  Token TVar2;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> sVar3;
  anon_class_8_1_8991fb9c *in_stack_00000090;
  SyntaxKind in_stack_0000009c;
  Token *in_stack_000000a0;
  TokenKind in_stack_000000ae;
  Parser *in_stack_000000b0;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endkeyword;
  Token semi;
  Token keyword;
  Preprocessor *pp;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffec0;
  ParserBase *in_stack_fffffffffffffed0;
  ParserBase *pPVar4;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_108;
  undefined8 local_d0;
  undefined8 in_stack_ffffffffffffff38;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffff40;
  pointer local_60;
  __extent_storage<18446744073709551615UL> local_58;
  SyntaxFactory *local_50;
  SyntaxList<slang::syntax::MemberSyntax> *local_48;
  undefined8 local_40;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  this_00 = ParserBase::getPP(in_RDI);
  Preprocessor::pushDesignElementStack(this_00);
  ParserBase::consume(in_stack_fffffffffffffed0);
  TVar2 = ParserBase::expect(in_stack_ffffffffffffff40,kind);
  Token::Token((Token *)in_stack_fffffffffffffeb0);
  sVar3 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseAnonymousProgram(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
                    (in_stack_000000b0,in_stack_000000ae,in_stack_000000a0,in_stack_0000009c,
                     in_stack_00000090);
  Preprocessor::popDesignElementStack(this_00);
  pPVar4 = in_RDI + 1;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffec0._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffeb8;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffeb0,elements);
  local_40 = TVar2._0_8_;
  local_d0 = local_40;
  local_60 = sVar3._M_ptr;
  local_58 = sVar3._M_extent._M_extent_value;
  sVar3._M_extent._M_extent_value = in_stack_fffffffffffffec0._M_extent_value;
  sVar3._M_ptr = (pointer)in_stack_fffffffffffffeb8;
  slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffeb0,sVar3);
  keyword_00.info = (Info *)pPVar4;
  keyword_00._0_8_ = in_RDI;
  semi_00.info = (Info *)in_stack_fffffffffffffec0._M_extent_value;
  semi_00._0_8_ = local_48;
  endkeyword_00.info = (Info *)local_58._M_extent_value;
  endkeyword_00._0_8_ = local_60;
  pAVar1 = slang::syntax::SyntaxFactory::anonymousProgram
                     (local_50,&local_108,keyword_00,semi_00,local_48,endkeyword_00);
  return pAVar1;
}

Assistant:

AnonymousProgramSyntax& Parser::parseAnonymousProgram(AttrList attributes) {
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto keyword = consume();
    auto semi = expect(TokenKind::Semicolon);

    Token endkeyword;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndProgramKeyword, endkeyword, SyntaxKind::AnonymousProgram,
        [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    pp.popDesignElementStack();

    return factory.anonymousProgram(attributes, keyword, semi, members, endkeyword);
}